

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_ref_frame_for_partition
               (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,MV_REFERENCE_FRAME *ref_frame_partition,
               MB_MODE_INFO *mi,uint *y_sad,uint *y_sad_g,uint *y_sad_alt,YV12_BUFFER_CONFIG *yv12_g
               ,YV12_BUFFER_CONFIG *yv12_alt,int mi_row,int mi_col,int num_planes)

{
  YV12_BUFFER_CONFIG *in_RCX;
  AV1_COMMON *in_RDX;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  long in_R8;
  scale_factors *in_R9;
  bool bVar1;
  bool bVar2;
  uint *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  _Bool is_set_altref_ref_frame;
  _Bool is_set_golden_ref_frame;
  AV1_COMMON *cm;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff8f;
  AV1_COMMON *in_stack_ffffffffffffff90;
  
  bVar1 = false;
  if ((double)*in_stack_00000008 < (double)(uint)in_R9->x_scale_fp * 0.9) {
    bVar1 = *in_stack_00000008 < *(uint *)CONCAT44(in_stack_00000014,in_stack_00000010);
  }
  bVar2 = false;
  if ((double)*(uint *)CONCAT44(in_stack_00000014,in_stack_00000010) <
      (double)(uint)in_R9->x_scale_fp * 0.9) {
    bVar2 = *(uint *)CONCAT44(in_stack_00000014,in_stack_00000010) < *in_stack_00000008;
  }
  if (bVar1) {
    get_ref_scale_factors(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
    av1_setup_pre_planes
              (in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
               in_R9,in_stack_00000010);
    *(undefined1 *)(in_R8 + 0x10) = 4;
    *(undefined4 *)(in_R8 + 8) = 0;
    in_R9->x_scale_fp = *in_stack_00000008;
    *(undefined1 *)&in_RCX->field_0 = 4;
    *(undefined4 *)(in_RSI[6].plane[1].seg_qmatrix[2] + 8) = 0;
    *(undefined4 *)(in_RSI[10].plane[0].seg_qmatrix[7] + 0x10) = 0;
  }
  else if (bVar2) {
    get_ref_scale_factors(in_RDX,in_stack_ffffffffffffff8f);
    av1_setup_pre_planes
              (in_RSI,(int)((ulong)in_RDX >> 0x20),in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
               in_R9,in_stack_00000010);
    *(undefined1 *)(in_R8 + 0x10) = 7;
    *(undefined4 *)(in_R8 + 8) = 0;
    in_R9->x_scale_fp = *(int *)CONCAT44(in_stack_00000014,in_stack_00000010);
    *(undefined1 *)&in_RCX->field_0 = 7;
    *(undefined4 *)(in_RSI[6].plane[1].seg_qmatrix[2] + 8) = 0;
    *(undefined4 *)(in_RSI[10].plane[0].seg_qmatrix[7] + 0x10) = 0;
  }
  else {
    *(undefined1 *)&in_RCX->field_0 = 1;
    *(undefined4 *)(in_RSI[6].plane[1].seg_qmatrix[2] + 8) = *(undefined4 *)(in_RDI + 0x60cac);
  }
  return;
}

Assistant:

static inline void set_ref_frame_for_partition(
    AV1_COMP *cpi, MACROBLOCK *x, MACROBLOCKD *xd,
    MV_REFERENCE_FRAME *ref_frame_partition, MB_MODE_INFO *mi,
    unsigned int *y_sad, unsigned int *y_sad_g, unsigned int *y_sad_alt,
    const YV12_BUFFER_CONFIG *yv12_g, const YV12_BUFFER_CONFIG *yv12_alt,
    int mi_row, int mi_col, int num_planes) {
  AV1_COMMON *const cm = &cpi->common;
  const bool is_set_golden_ref_frame =
      *y_sad_g < 0.9 * *y_sad && *y_sad_g < *y_sad_alt;
  const bool is_set_altref_ref_frame =
      *y_sad_alt < 0.9 * *y_sad && *y_sad_alt < *y_sad_g;

  if (is_set_golden_ref_frame) {
    av1_setup_pre_planes(xd, 0, yv12_g, mi_row, mi_col,
                         get_ref_scale_factors(cm, GOLDEN_FRAME), num_planes);
    mi->ref_frame[0] = GOLDEN_FRAME;
    mi->mv[0].as_int = 0;
    *y_sad = *y_sad_g;
    *ref_frame_partition = GOLDEN_FRAME;
    x->nonrd_prune_ref_frame_search = 0;
    x->sb_me_partition = 0;
  } else if (is_set_altref_ref_frame) {
    av1_setup_pre_planes(xd, 0, yv12_alt, mi_row, mi_col,
                         get_ref_scale_factors(cm, ALTREF_FRAME), num_planes);
    mi->ref_frame[0] = ALTREF_FRAME;
    mi->mv[0].as_int = 0;
    *y_sad = *y_sad_alt;
    *ref_frame_partition = ALTREF_FRAME;
    x->nonrd_prune_ref_frame_search = 0;
    x->sb_me_partition = 0;
  } else {
    *ref_frame_partition = LAST_FRAME;
    x->nonrd_prune_ref_frame_search =
        cpi->sf.rt_sf.nonrd_prune_ref_frame_search;
  }
}